

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  long lVar2;
  Scalar SVar3;
  Index IVar4;
  Index IVar5;
  CoeffReturnType local_48;
  long local_40;
  Index j;
  Index i_1;
  long local_28;
  Index i;
  Scalar res;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *mat_local;
  
  res = (Scalar)func;
  func_local = (scalar_sum_op<double,_double> *)mat;
  IVar4 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
          ::rows(mat);
  bVar1 = false;
  if (0 < IVar4) {
    IVar4 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::cols((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)func_local);
    bVar1 = false;
    if (0 < IVar4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Redux.h"
                  ,0xc0,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, Traversal = 0, Unrolling = 0]"
                 );
  }
  i = (Index)redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
             ::coeffByOuterInner((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                  *)func_local,0,0);
  local_28 = 1;
  while( true ) {
    lVar2 = local_28;
    IVar4 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::innerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)func_local);
    SVar3 = res;
    if (IVar4 <= lVar2) break;
    i_1 = (Index)redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                 ::coeffByOuterInner((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                      *)func_local,0,local_28);
    i = (Index)scalar_sum_op<double,_double>::operator()
                         ((scalar_sum_op<double,_double> *)SVar3,(double *)&i,(double *)&i_1);
    local_28 = local_28 + 1;
  }
  j = 1;
  while( true ) {
    IVar4 = j;
    IVar5 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::outerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)func_local);
    if (IVar5 <= IVar4) break;
    local_40 = 0;
    while( true ) {
      lVar2 = local_40;
      IVar4 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
              ::innerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)func_local);
      SVar3 = res;
      if (IVar4 <= lVar2) break;
      local_48 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                 ::coeffByOuterInner((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                                      *)func_local,j,local_40);
      i = (Index)scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)SVar3,(double *)&i,&local_48);
      local_40 = local_40 + 1;
    }
    j = j + 1;
  }
  return (Scalar)i;
}

Assistant:

Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }